

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

text * lest::compiler_abi_cxx11_(void)

{
  text *in_RDI;
  ostringstream os;
  size_type *local_1a8;
  size_type local_1a0;
  size_type local_198;
  undefined8 uStack_190;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"clang ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,
             "19.1.5 (https://github.com/swiftlang/llvm-project.git 188208b14562121ae1ac90190d00d823bcfbccff)"
             ,0x5f);
  std::__cxx11::stringbuf::str();
  if (local_1a8 == &local_198) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    (in_RDI->field_2)._M_allocated_capacity = local_198;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uStack_190;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)local_1a8;
    (in_RDI->field_2)._M_allocated_capacity = local_198;
  }
  in_RDI->_M_string_length = local_1a0;
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return in_RDI;
}

Assistant:

inline text compiler()
{
    std::ostringstream os;
#if   defined (__clang__ )
    os << "clang " << __clang_version__;
#elif defined (__GNUC__  )
    os << "gcc " << __GNUC__ << "." << __GNUC_MINOR__ << "." << __GNUC_PATCHLEVEL__;
#elif defined ( _MSC_VER )
    os << "MSVC " << lest_COMPILER_MSVC_VERSION << " (" << _MSC_VER << ")";
#else
    os << "[compiler]";
#endif
    return os.str();
}